

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

VkExtent2D
vkb::detail::find_extent
          (VkSurfaceCapabilitiesKHR *capabilities,uint32_t desired_width,uint32_t desired_height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  VkExtent2D VVar4;
  
  uVar3 = (capabilities->currentExtent).width;
  if (uVar3 == 0xffffffff) {
    uVar3 = (capabilities->maxImageExtent).width;
    if (uVar3 < desired_width) {
      desired_width = uVar3;
    }
    uVar1 = (capabilities->minImageExtent).width;
    uVar2 = (capabilities->minImageExtent).height;
    uVar3 = desired_width;
    if (desired_width < uVar1) {
      uVar3 = uVar1;
    }
    uVar1 = (capabilities->maxImageExtent).height;
    if (uVar1 < desired_height) {
      desired_height = uVar1;
    }
    if (desired_height < uVar2) {
      desired_height = uVar2;
    }
  }
  else {
    desired_height = (capabilities->currentExtent).height;
  }
  VVar4.height = desired_height;
  VVar4.width = uVar3;
  return VVar4;
}

Assistant:

VkExtent2D find_extent(VkSurfaceCapabilitiesKHR const& capabilities, uint32_t desired_width, uint32_t desired_height) {
    if (capabilities.currentExtent.width != UINT32_MAX) {
        return capabilities.currentExtent;
    } else {
        VkExtent2D actualExtent = { desired_width, desired_height };

        actualExtent.width =
            maximum(capabilities.minImageExtent.width, minimum(capabilities.maxImageExtent.width, actualExtent.width));
        actualExtent.height =
            maximum(capabilities.minImageExtent.height, minimum(capabilities.maxImageExtent.height, actualExtent.height));

        return actualExtent;
    }
}